

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DNATypes.cpp
# Opt level: O0

bool DNA::contains(Base *dna1,size_t size1,Base *dna2,size_t size2)

{
  bool bVar1;
  Base *local_50;
  Base *matcher;
  Base *end2;
  Base *end1;
  bool mode;
  size_t size2_local;
  Base *dna2_local;
  size_t size1_local;
  Base *dna1_local;
  
  bVar1 = false;
  local_50 = dna2;
  size1_local = (size_t)dna1;
  if (size1 < size2) {
    dna1_local._7_1_ = false;
  }
  else {
    for (; (Base *)size1_local != dna1 + size1; size1_local = size1_local + 4) {
      if (bVar1) {
        if (local_50 == dna2 + size2) {
          return true;
        }
        if (*local_50 == *(Base *)size1_local) {
          local_50 = local_50 + 1;
        }
        else {
          bVar1 = false;
          local_50 = dna2;
        }
      }
      else if (*local_50 == *(Base *)size1_local) {
        bVar1 = true;
        local_50 = local_50 + 1;
      }
    }
    if (local_50 == dna2 + size2) {
      dna1_local._7_1_ = true;
    }
    else {
      dna1_local._7_1_ = false;
    }
  }
  return dna1_local._7_1_;
}

Assistant:

bool DNA::contains(const DNA::Base* dna1, 
                   size_t size1, 
                   const DNA::Base* dna2, 
                   size_t size2)
{
    bool mode = false;
    const DNA::Base* end1 = dna1 + size1;
    const DNA::Base* end2 = dna2 + size2;
    const DNA::Base* matcher = dna2;
    if (size2 > size1)
        return false;
    while (dna1 != end1) {
        if (mode) {
            if (matcher == end2)
                return true;
            else if (*matcher == *dna1)
                ++matcher;
            else {
                matcher = dna2;
                mode = false;
            }
        } else {
            if (*matcher == *dna1) {
                mode = true;
                ++matcher;
            }
        }
        ++dna1;
    }
    // Check once here incase it's at the end
    if (matcher == end2)
        return true;
    return false;
}